

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# itemviews.cpp
# Opt level: O3

void __thiscall QAccessibleTableCell::doAction(QAccessibleTableCell *this,QString *actionName)

{
  long lVar1;
  char cVar2;
  long lVar3;
  QStringView QVar4;
  QStringView QVar5;
  
  lVar3 = QAccessibleActionInterface::toggleAction();
  lVar1 = (actionName->d).size;
  if (lVar1 == *(long *)(lVar3 + 0x10)) {
    QVar4.m_data = (actionName->d).ptr;
    QVar4.m_size = lVar1;
    QVar5.m_data = *(storage_type_conflict **)(lVar3 + 8);
    QVar5.m_size = lVar1;
    cVar2 = QtPrivate::equalStrings(QVar4,QVar5);
    if (cVar2 != '\0') {
      cVar2 = (**(code **)(*(long *)this + 0xd8))(this);
      if (cVar2 != '\0') {
        unselectCell(this);
        return;
      }
      selectCell(this);
      return;
    }
  }
  return;
}

Assistant:

void QAccessibleTableCell::doAction(const QString& actionName)
{
    if (actionName == toggleAction()) {
#if defined(Q_OS_ANDROID)
        QAccessibleInterface *parentInterface = parent();
        while (parentInterface){
            if (parentInterface->role() == QAccessible::ComboBox) {
                selectCell();
                parentInterface->actionInterface()->doAction(pressAction());
                return;
            } else {
                parentInterface = parentInterface->parent();
            }
        }
#endif
        if (isSelected()) {
            unselectCell();
        } else {
            selectCell();
        }
    }
}